

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateSequenceReset(Session *this,SEQNUM beginSeqNo,SEQNUM endSeqNo)

{
  FieldMap *pFVar1;
  Header *pHVar2;
  UtcTimeStampField *this_00;
  IntTConvertor<unsigned_long> *this_01;
  unsigned_long value;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  BOOLEAN local_389;
  FieldBase local_388;
  FieldBase local_330;
  UtcTimeStamp local_2d8;
  BOOLEAN local_2b9;
  FieldBase local_2b8;
  undefined1 local_260 [8];
  NewSeqNo newSeqNo;
  allocator<char> local_1f1;
  STRING local_1f0;
  MsgType local_1d0;
  undefined1 local_178 [8];
  Message sequenceReset;
  SEQNUM endSeqNo_local;
  SEQNUM beginSeqNo_local;
  Session *this_local;
  
  sequenceReset._336_8_ = endSeqNo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"4",&local_1f1);
  MsgType::MsgType(&local_1d0,&local_1f0);
  newMessage((Message *)local_178,this,&local_1d0);
  MsgType::~MsgType(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  NewSeqNo::NewSeqNo((NewSeqNo *)local_260,sequenceReset._336_8_);
  pFVar1 = &Message::getHeader((Message *)local_178)->super_FieldMap;
  local_2b9 = true;
  PossDupFlag::PossDupFlag((PossDupFlag *)&local_2b8,&local_2b9);
  FieldMap::setField(pFVar1,&local_2b8,true);
  PossDupFlag::~PossDupFlag((PossDupFlag *)&local_2b8);
  FieldMap::setField((FieldMap *)local_178,(FieldBase *)local_260,true);
  pHVar2 = Message::getHeader((Message *)local_178);
  fill(this,pHVar2);
  pHVar2 = Message::getHeader((Message *)local_178);
  pFVar1 = &Message::getHeader((Message *)local_178)->super_FieldMap;
  this_00 = &FieldMap::getField<FIX::SendingTime>(pFVar1)->super_UtcTimeStampField;
  UtcTimeStampField::operator_cast_to_UtcTimeStamp(&local_2d8,this_00);
  insertOrigSendingTime(this,pHVar2,&local_2d8);
  UtcTimeStamp::~UtcTimeStamp(&local_2d8);
  pFVar1 = &Message::getHeader((Message *)local_178)->super_FieldMap;
  MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_330,beginSeqNo);
  FieldMap::setField(pFVar1,&local_330,true);
  MsgSeqNum::~MsgSeqNum((MsgSeqNum *)&local_330);
  local_389 = true;
  GapFillFlag::GapFillFlag((GapFillFlag *)&local_388,&local_389);
  FieldMap::setField((FieldMap *)local_178,&local_388,true);
  GapFillFlag::~GapFillFlag((GapFillFlag *)&local_388);
  sendRaw(this,(Message *)local_178,beginSeqNo);
  this_01 = (IntTConvertor<unsigned_long> *)
            UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_260);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_3d0,this_01,value);
  std::operator+(&local_3b0,"Sent SequenceReset TO: ",&local_3d0);
  SessionState::onEvent(&this->m_state,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  NewSeqNo::~NewSeqNo((NewSeqNo *)local_260);
  Message::~Message((Message *)local_178);
  return;
}

Assistant:

void Session::generateSequenceReset(SEQNUM beginSeqNo, SEQNUM endSeqNo) {
  Message sequenceReset = newMessage(MsgType(MsgType_SequenceReset));

  NewSeqNo newSeqNo(endSeqNo);
  sequenceReset.getHeader().setField(PossDupFlag(true));
  sequenceReset.setField(newSeqNo);
  fill(sequenceReset.getHeader());

  insertOrigSendingTime(sequenceReset.getHeader(), sequenceReset.getHeader().getField<SendingTime>());
  sequenceReset.getHeader().setField(MsgSeqNum(beginSeqNo));
  sequenceReset.setField(GapFillFlag(true));
  sendRaw(sequenceReset, beginSeqNo);
  m_state.onEvent("Sent SequenceReset TO: " + SEQNUM_CONVERTOR::convert(newSeqNo));
}